

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void mi_stats_merge_from(mi_stats_t *stats)

{
  mi_stats_t *in_RDI;
  
  if (in_RDI != &_mi_stats_main) {
    mi_stats_add(stats,in_RDI);
    memset(in_RDI,0,0x1058);
  }
  return;
}

Assistant:

static void mi_stats_merge_from(mi_stats_t* stats) {
  if (stats != &_mi_stats_main) {
    mi_stats_add(&_mi_stats_main, stats);
    memset(stats, 0, sizeof(mi_stats_t));
  }
}